

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_Next_MIRROR(void)

{
  Z80Reg ZVar1;
  Z80Reg reg;
  
  if (DAT_001e16a8._4_4_ < 1) {
    Error("Z80N instructions are currently disabled",bp,SUPPRESS);
  }
  else {
    ZVar1 = GetRegister(&::lp);
    if ((ZVar1 == Z80_UNK) || (ZVar1 == Z80_A)) {
      EmitByte(0xed,true);
      EmitByte(0x24,false);
    }
    else {
      Error("[MIRROR] Illegal operand (can be only register A)",::line,PASS3);
    }
  }
  return;
}

Assistant:

static void OpCode_Next_MIRROR() {
		if (Options::syx.IsNextEnabled < 1) {
			Error("Z80N instructions are currently disabled", bp, SUPPRESS);
			return;
		}
		Z80Reg reg = GetRegister(lp);
		if (Z80_UNK != reg && Z80_A != reg) {
			Error("[MIRROR] Illegal operand (can be only register A)", line);
			return;
		}
		EmitByte(0xED, true);
		EmitByte(0x24);
	}